

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

bool ImGui::IsItemDeactivated(void)

{
  uint uVar1;
  ImGuiID IVar2;
  bool bVar3;
  
  uVar1 = (GImGui->CurrentWindow->DC).LastItemStatusFlags;
  if ((uVar1 & 0x20) == 0) {
    IVar2 = GImGui->ActiveIdPreviousFrame;
    bVar3 = false;
    if ((IVar2 != 0) && (IVar2 == (GImGui->CurrentWindow->DC).LastItemId)) {
      bVar3 = GImGui->ActiveId != IVar2;
    }
    return bVar3;
  }
  return SUB41((uVar1 & 0x40) >> 6,0);
}

Assistant:

bool ImGui::IsItemDeactivated()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (window->DC.LastItemStatusFlags & ImGuiItemStatusFlags_HasDeactivated)
        return (window->DC.LastItemStatusFlags & ImGuiItemStatusFlags_Deactivated) != 0;
    return (g.ActiveIdPreviousFrame == window->DC.LastItemId && g.ActiveIdPreviousFrame != 0 && g.ActiveId != window->DC.LastItemId);
}